

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

void __thiscall
AutoCodeGenPhase::EndPhase
          (AutoCodeGenPhase *this,Func *func,Phase phase,bool dump,bool isPhaseComplete)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  
  if (this->func != func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x481,"(this->func == func)","this->func == func");
    if (!bVar2) goto LAB_003f29a5;
    *puVar4 = 0;
  }
  if (this->phase != phase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x482,"(this->phase == phase)","this->phase == phase");
    if (!bVar2) {
LAB_003f29a5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (dump) {
    sourceContextId = Func::GetSourceContextId(func);
    functionId = Func::GetLocalFunctionId(func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,SimpleJitPhase,sourceContextId,functionId)
    ;
    bVar2 = true;
    if (!bVar3) {
      bVar2 = Func::IsSimpleJit(func);
      bVar2 = !bVar2;
    }
  }
  else {
    bVar2 = false;
  }
  this->dump = bVar2;
  this->isPhaseComplete = isPhaseComplete;
  return;
}

Assistant:

void EndPhase(Func * func, Js::Phase phase, bool dump, bool isPhaseComplete)
    {
        Assert(this->func == func);
        Assert(this->phase == phase);
        this->dump = dump && (PHASE_DUMP(Js::SimpleJitPhase, func) || !func->IsSimpleJit());
        this->isPhaseComplete = isPhaseComplete;
    }